

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
llvm::SmallVectorTemplateBase<$d3e3f58d$>::grow
          (SmallVectorTemplateBase<_d3e3f58d_> *this,size_t MinSize)

{
  void *pvVar1;
  void *pvVar2;
  bool bVar3;
  size_t sVar4;
  Unparsed *Dest;
  Unparsed *NewElts;
  size_t NewCapacity;
  size_t CurSize;
  size_t CurCapacity;
  size_t MinSize_local;
  SmallVectorTemplateBase<_d3e3f58d_> *this_local;
  
  sVar4 = SmallVectorTemplateCommon<$82bc3fea$>::capacity
                    (&this->super_SmallVectorTemplateCommon<_82bc3fea_>);
  pvVar1 = (this->super_SmallVectorTemplateCommon<_82bc3fea_>).super_SmallVectorBase.EndX;
  pvVar2 = (this->super_SmallVectorTemplateCommon<_82bc3fea_>).super_SmallVectorBase.BeginX;
  NewElts = (Unparsed *)NextPowerOf2(sVar4 + 2);
  if (NewElts < MinSize) {
    NewElts = (Unparsed *)MinSize;
  }
  Dest = (Unparsed *)malloc((long)NewElts * 0x18);
  uninitialized_move<_5ca38e48_>
            ((Unparsed *)
             (this->super_SmallVectorTemplateCommon<_82bc3fea_>).super_SmallVectorBase.BeginX,
             (Unparsed *)
             (this->super_SmallVectorTemplateCommon<_82bc3fea_>).super_SmallVectorBase.EndX,Dest);
  destroy_range((Unparsed *)
                (this->super_SmallVectorTemplateCommon<_82bc3fea_>).super_SmallVectorBase.BeginX,
                (Unparsed *)
                (this->super_SmallVectorTemplateCommon<_82bc3fea_>).super_SmallVectorBase.EndX);
  bVar3 = SmallVectorTemplateCommon<$82bc3fea$>::isSmall
                    (&this->super_SmallVectorTemplateCommon<_82bc3fea_>);
  if (!bVar3) {
    free((this->super_SmallVectorTemplateCommon<_82bc3fea_>).super_SmallVectorBase.BeginX);
  }
  SmallVectorTemplateCommon<$82bc3fea$>::setEnd
            (&this->super_SmallVectorTemplateCommon<_82bc3fea_>,
             Dest + ((long)pvVar1 - (long)pvVar2) / 0x18);
  (this->super_SmallVectorTemplateCommon<_82bc3fea_>).super_SmallVectorBase.BeginX = Dest;
  (this->super_SmallVectorTemplateCommon<_82bc3fea_>).super_SmallVectorBase.CapacityX =
       (void *)((long)(this->super_SmallVectorTemplateCommon<_82bc3fea_>).super_SmallVectorBase.
                      BeginX + (long)NewElts * 0x18);
  return;
}

Assistant:

void SmallVectorTemplateBase<T, isPodLike>::grow(size_t MinSize) {
  size_t CurCapacity = this->capacity();
  size_t CurSize = this->size();
  // Always grow, even from zero.
  size_t NewCapacity = size_t(NextPowerOf2(CurCapacity+2));
  if (NewCapacity < MinSize)
    NewCapacity = MinSize;
  T *NewElts = static_cast<T*>(malloc(NewCapacity*sizeof(T)));

  // Move the elements over.
  this->uninitialized_move(this->begin(), this->end(), NewElts);

  // Destroy the original elements.
  destroy_range(this->begin(), this->end());

  // If this wasn't grown from the inline copy, deallocate the old space.
  if (!this->isSmall())
    free(this->begin());

  this->setEnd(NewElts+CurSize);
  this->BeginX = NewElts;
  this->CapacityX = this->begin()+NewCapacity;
}